

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::UpdateSourceCodeInfo
          (OptionInterpreter *this,SourceCodeInfo *info)

{
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *this_00;
  void *pvVar1;
  anon_union_96_1_493b367e_for_SourceCodeInfo_Location_3 aVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Rep *pRVar6;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *pRVar7;
  const_reference piVar8;
  SourceCodeInfo_Location *pSVar9;
  SourceCodeInfo_Location *pSVar10;
  pointer prVar11;
  Rep *extraout_RAX;
  int *piVar12;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *pRVar13;
  int j;
  ulong uVar14;
  RepeatedField<int> *this_01;
  vector<int,_std::allocator<int>_> pathv;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> new_locs;
  iterator entry;
  vector<int,_std::allocator<int>_> local_98;
  ulong local_80;
  RepeatedPtrFieldBase local_78;
  SourceCodeInfo *local_60;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
  *local_58;
  iterator local_50;
  iterator local_40;
  
  local_58 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
              *)&this->interpreted_paths_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)local_58);
  if (1 < *(size_t *)
           ((long)&(this->interpreted_paths_).
                   super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   .
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value + 8)) {
    this_00 = &(info->field_0)._impl_.location_;
    local_78.tagged_rep_or_elem_ = (void *)0x0;
    local_78.current_size_ = 0;
    local_78.capacity_proxy_ = 0;
    local_78.arena_ = (Arena *)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    pRVar13 = this_00;
    if ((*(byte *)((long)&info->field_0 + 0x18) & 1) != 0) {
      pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      pRVar13 = (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)pRVar6->elements;
    }
    bVar3 = false;
    local_80 = 0;
    local_60 = info;
    while( true ) {
      pRVar7 = this_00;
      if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
        pRVar7 = (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)pRVar6->elements;
      }
      if (pRVar13 ==
          (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
          (&(pRVar7->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
          *(int *)((long)&local_60->field_0 + 0x20))) break;
      if ((bVar3) &&
         (pvVar1 = (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_,
         iVar4 = internal::SooRep::size
                           ((SooRep *)((long)pvVar1 + 0x18),
                            (*(byte *)((long)pvVar1 + 0x18) & 4) == 0),
         (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2 <= (long)iVar4)) {
        bVar3 = true;
        if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          uVar14 = 0;
          do {
            piVar8 = RepeatedField<int>::Get
                               ((RepeatedField<int> *)
                                ((long)(pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                                0x18),(int)uVar14);
            if (*piVar8 !=
                local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14]) goto LAB_001cf12b;
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)((long)local_98.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
      }
      else {
LAB_001cf12b:
        if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        for (iVar4 = 0; pvVar1 = (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_,
            iVar5 = internal::SooRep::size
                              ((SooRep *)((long)pvVar1 + 0x18),
                               (*(byte *)((long)pvVar1 + 0x18) & 4) == 0), iVar4 < iVar5;
            iVar4 = iVar4 + 1) {
          piVar8 = RepeatedField<int>::Get
                             ((RepeatedField<int> *)
                              ((long)(pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                              0x18),iVar4);
          local_50.ctrl_._0_4_ = *piVar8;
          if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_98,
                       (iterator)
                       local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_50);
          }
          else {
            *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = *piVar8;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        local_50 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
                   ::find<std::vector<int,std::allocator<int>>>(local_58,&local_98);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)local_58);
        local_40.ctrl_ = (ctrl_t *)0x0;
        bVar3 = absl::lts_20250127::container_internal::operator==(&local_50,&local_40);
        if (bVar3) {
          if ((local_80 & 1) != 0) {
            pSVar10 = (SourceCodeInfo_Location *)
                      (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
            pSVar9 = (SourceCodeInfo_Location *)
                     internal::RepeatedPtrFieldBase::AddMessageLite
                               (&local_78,
                                Arena::DefaultConstruct<google::protobuf::SourceCodeInfo_Location>);
            SourceCodeInfo_Location::CopyFrom(pSVar9,pSVar10);
          }
        }
        else {
          if ((local_80 & 1) == 0) {
            internal::RepeatedPtrFieldBase::Reserve
                      (&local_78,*(int *)((long)&local_60->field_0 + 0x20));
            pRVar6 = extraout_RAX;
            pRVar7 = this_00;
            if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
              pRVar7 = (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                       pRVar6->elements;
            }
            local_80 = CONCAT71((int7)((ulong)pRVar6 >> 8),1);
            for (; pRVar7 != pRVar13;
                pRVar7 = (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                         &(pRVar7->super_RepeatedPtrFieldBase).current_size_) {
              pSVar10 = (SourceCodeInfo_Location *)
                        (pRVar7->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
              pSVar9 = (SourceCodeInfo_Location *)
                       internal::RepeatedPtrFieldBase::AddMessageLite
                                 (&local_78,
                                  Arena::DefaultConstruct<google::protobuf::SourceCodeInfo_Location>
                                 );
              SourceCodeInfo_Location::CopyFrom(pSVar9,pSVar10);
            }
          }
          pSVar10 = (SourceCodeInfo_Location *)
                    internal::RepeatedPtrFieldBase::AddMessageLite
                              (&local_78,
                               Arena::DefaultConstruct<google::protobuf::SourceCodeInfo_Location>);
          SourceCodeInfo_Location::CopyFrom
                    (pSVar10,(SourceCodeInfo_Location *)
                             (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
          this_01 = &(pSVar10->field_0)._impl_.path_;
          aVar2 = pSVar10->field_0;
          if (((undefined1  [96])aVar2 & (undefined1  [96])0x4) != (undefined1  [96])0x0) {
            internal::LongSooRep::elements((LongSooRep *)this_01);
          }
          internal::SooRep::size
                    (&this_01->soo_rep_,
                     ((undefined1  [96])aVar2 & (undefined1  [96])0x4) == (undefined1  [96])0x0);
          iVar4 = internal::SooRep::size
                            (&this_01->soo_rep_,
                             ((undefined1  [96])aVar2 & (undefined1  [96])0x4) ==
                             (undefined1  [96])0x0);
          if ((iVar4 != 0) &&
             ((undefined1  [16])
              ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) !=
              (undefined1  [16])0x0)) {
            internal::LongSooRep::elements((LongSooRep *)this_01);
          }
          RepeatedField<int>::set_size
                    (this_01,((undefined1  [96])aVar2 & (undefined1  [96])0x4) ==
                             (undefined1  [96])0x0,0);
          prVar11 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::iterator::operator->(&local_50);
          for (piVar12 = (prVar11->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              prVar11 = absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::iterator::operator->(&local_50),
              piVar12 !=
              (prVar11->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish; piVar12 = piVar12 + 1) {
            RepeatedField<int>::Add(this_01,*piVar12);
          }
        }
        bVar3 = !bVar3;
      }
      pRVar13 = (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_;
    }
    if (((byte)local_80 & &this_00->super_RepeatedPtrFieldBase != &local_78) != 0) {
      if ((local_60->field_0)._impl_.location_.super_RepeatedPtrFieldBase.arena_ == local_78.arena_)
      {
        RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::InternalSwap
                  (this_00,(RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)&local_78)
        ;
      }
      else {
        internal::RepeatedPtrFieldBase::
        CopyFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                  (&this_00->super_RepeatedPtrFieldBase,&local_78);
      }
    }
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)&local_78);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::UpdateSourceCodeInfo(
    SourceCodeInfo* info) {
  if (interpreted_paths_.empty()) {
    // nothing to do!
    return;
  }

  // We find locations that match keys in interpreted_paths_ and
  // 1) replace the path with the corresponding value in interpreted_paths_
  // 2) remove any subsequent sub-locations (sub-location is one whose path
  //    has the parent path as a prefix)
  //
  // To avoid quadratic behavior of removing interior rows as we go,
  // we keep a copy. But we don't actually copy anything until we've
  // found the first match (so if the source code info has no locations
  // that need to be changed, there is zero copy overhead).

  RepeatedPtrField<SourceCodeInfo_Location>* locs = info->mutable_location();
  RepeatedPtrField<SourceCodeInfo_Location> new_locs;
  bool copying = false;

  std::vector<int> pathv;
  bool matched = false;

  for (RepeatedPtrField<SourceCodeInfo_Location>::iterator loc = locs->begin();
       loc != locs->end(); loc++) {
    if (matched) {
      // see if this location is in the range to remove
      bool loc_matches = true;
      if (loc->path_size() < static_cast<int64_t>(pathv.size())) {
        loc_matches = false;
      } else {
        for (size_t j = 0; j < pathv.size(); j++) {
          if (loc->path(j) != pathv[j]) {
            loc_matches = false;
            break;
          }
        }
      }

      if (loc_matches) {
        // don't copy this row since it is a sub-location that we're removing
        continue;
      }

      matched = false;
    }

    pathv.clear();
    for (int j = 0; j < loc->path_size(); j++) {
      pathv.push_back(loc->path(j));
    }

    auto entry = interpreted_paths_.find(pathv);

    if (entry == interpreted_paths_.end()) {
      // not a match
      if (copying) {
        *new_locs.Add() = *loc;
      }
      continue;
    }

    matched = true;

    if (!copying) {
      // initialize the copy we are building
      copying = true;
      new_locs.Reserve(locs->size());
      for (RepeatedPtrField<SourceCodeInfo_Location>::iterator it =
               locs->begin();
           it != loc; it++) {
        *new_locs.Add() = *it;
      }
    }

    // add replacement and update its path
    SourceCodeInfo_Location* replacement = new_locs.Add();
    *replacement = *loc;
    replacement->clear_path();
    for (std::vector<int>::iterator rit = entry->second.begin();
         rit != entry->second.end(); rit++) {
      replacement->add_path(*rit);
    }
  }

  // if we made a changed copy, put it in place
  if (copying) {
    *locs = std::move(new_locs);
  }
}